

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveIntegration.h
# Opt level: O2

void __thiscall libchess::Position::make_move(Position *this,Move move)

{
  byte *pbVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  byte bVar5;
  Type TVar6;
  long lVar7;
  optional<libchess::PieceType> oVar8;
  optional<libchess::PieceType> oVar9;
  hash_type hVar10;
  sbyte sVar11;
  long lVar13;
  uint uVar14;
  Square square;
  ulong uVar15;
  ulong uVar16;
  Square square_00;
  State local_68;
  sbyte sVar12;
  
  iVar3 = (this->side_to_move_).super_MetaValueType<int>.value_;
  lVar13 = (long)iVar3;
  if (lVar13 == 1) {
    this->fullmoves_ = this->fullmoves_ + 1;
  }
  this->ply_ = this->ply_ + 1;
  local_68.castling_rights_.value_ = 0;
  local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square>._M_engaged = false;
  local_68.previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Move>._M_engaged = false;
  local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType>._M_engaged = false;
  local_68.move_type_ = NONE;
  local_68.hash_ = 0;
  local_68.pawn_hash_ = 0;
  local_68.halfmoves_ = 0;
  std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::
  emplace_back<libchess::Position::State>(&this->history_,&local_68);
  lVar7 = (long)this->ply_;
  pSVar4 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = pSVar4 + lVar7;
  pSVar4[lVar7].halfmoves_ = pSVar4[lVar7 + -1].halfmoves_ + 1;
  if (*(bool *)((long)&pSVar4[lVar7].previous_move_.super__Optional_base<libchess::Move,_true,_true>
                       ._M_payload + 4) == false) {
    *(bool *)((long)&(pSVar2->previous_move_).super__Optional_base<libchess::Move,_true,_true>.
                     _M_payload + 4) = true;
  }
  *(value_type *)
   &(pSVar2->previous_move_).super__Optional_base<libchess::Move,_true,_true>._M_payload.
    super__Optional_payload_base<libchess::Move> = move.value_;
  (pSVar2->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square> = (_Optional_payload_base<libchess::Square>)0x0;
  square.super_MetaValueType<int>.value_ = (MetaValueType<int>)(move.value_ & 0x3f);
  uVar16 = (ulong)(uint)square.super_MetaValueType<int>.value_;
  square_00.super_MetaValueType<int>.value_ = (MetaValueType<int>)((uint)move.value_ >> 6 & 0x3f);
  (pSVar2->castling_rights_).value_ =
       castling_spoilers[uVar16] & pSVar2[-1].castling_rights_.value_ &
       castling_spoilers[(uint)square_00.super_MetaValueType<int>.value_];
  oVar8 = piece_type_on(this,square);
  oVar9 = piece_type_on(this,square_00);
  TVar6 = move_type_of(this,move);
  if (((ulong)oVar8.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::PieceType> & 0x1ffffffff) == 0x100000000 ||
      ((ulong)oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::PieceType> >> 0x20 & 1) != 0) {
    pSVar2->halfmoves_ = 0;
  }
  if (TVar6 - 1 < 7) {
    uVar14 = (uint)move.value_ >> 0xc & 7;
    sVar11 = (sbyte)square_00.super_MetaValueType<int>.value_;
    sVar12 = (sbyte)square.super_MetaValueType<int>.value_;
    switch((uint)TVar6) {
    case 1:
      uVar16 = 1L << sVar11 ^ 1L << uVar16;
      this->piece_type_bb_
      [(int)oVar8.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
            super__Optional_payload_base<libchess::PieceType>._M_payload].value_ =
           this->piece_type_bb_
           [(int)oVar8.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                 super__Optional_payload_base<libchess::PieceType>._M_payload].value_ ^ uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ ^ uVar16;
      break;
    case 2:
      uVar16 = 1L << sVar11 ^ 1L << uVar16;
      this->piece_type_bb_[5].value_ = this->piece_type_bb_[5].value_ ^ uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ ^ uVar16;
      if ((ulong)(uint)square_00.super_MetaValueType<int>.value_ == 0x3e) {
        pbVar1 = (byte *)((long)&this->piece_type_bb_[3].value_ + 7);
        *pbVar1 = *pbVar1 ^ 0xa0;
        pbVar1 = (byte *)((long)&this->color_bb_[lVar13].value_ + 7);
        *pbVar1 = *pbVar1 ^ 0xa0;
      }
      else if (square_00.super_MetaValueType<int>.value_ == 6) {
        *(byte *)&this->piece_type_bb_[3].value_ = (byte)this->piece_type_bb_[3].value_ ^ 0xa0;
        *(byte *)&this->color_bb_[lVar13].value_ = (byte)this->color_bb_[lVar13].value_ ^ 0xa0;
      }
      else if (square_00.super_MetaValueType<int>.value_ == 0x3a) {
        pbVar1 = (byte *)((long)&this->piece_type_bb_[3].value_ + 7);
        *pbVar1 = *pbVar1 ^ 9;
        pbVar1 = (byte *)((long)&this->color_bb_[lVar13].value_ + 7);
        *pbVar1 = *pbVar1 ^ 9;
      }
      else if (square_00.super_MetaValueType<int>.value_ == 2) {
        *(byte *)&this->piece_type_bb_[3].value_ = (byte)this->piece_type_bb_[3].value_ ^ 9;
        *(byte *)&this->color_bb_[lVar13].value_ = (byte)this->color_bb_[lVar13].value_ ^ 9;
      }
      break;
    case 3:
      uVar16 = 1L << sVar11 ^ 1L << uVar16;
      this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ ^ uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ ^ uVar16;
      bVar5 = ((iVar3 != 0) * '\x10' + sVar11) - 8U & 0x3f;
      uVar16 = -2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5;
      this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ & uVar16;
      this->color_bb_[iVar3 == 0].value_ = this->color_bb_[iVar3 == 0].value_ & uVar16;
      break;
    case 4:
      uVar16 = -2L << sVar12 | 0xfffffffffffffffeU >> 0x40 - sVar12;
      this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ & uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ & uVar16;
      this->piece_type_bb_[uVar14].value_ = this->piece_type_bb_[uVar14].value_ | 1L << sVar11;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ | 1L << sVar11;
      break;
    case 5:
      uVar16 = 1L << sVar11 ^ 1L << uVar16;
      this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ ^ uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ ^ uVar16;
      if (*(bool *)((long)&(pSVar2->enpassant_square_).
                           super__Optional_base<libchess::Square,_true,_true>._M_payload + 4) ==
          false) {
        *(bool *)((long)&(pSVar2->enpassant_square_).
                         super__Optional_base<libchess::Square,_true,_true>._M_payload + 4) = true;
      }
      *(uint *)&(pSVar2->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
                _M_payload.super__Optional_payload_base<libchess::Square> =
           (uint)(iVar3 == 0) * 0x10 + (int)square.super_MetaValueType<int>.value_ + -8;
      break;
    case 6:
      uVar15 = -2L << sVar11 | 0xfffffffffffffffeU >> 0x40 - sVar11;
      this->piece_type_bb_
      [(int)oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
            super__Optional_payload_base<libchess::PieceType>._M_payload].value_ =
           this->piece_type_bb_
           [(int)oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                 super__Optional_payload_base<libchess::PieceType>._M_payload].value_ & uVar15;
      this->color_bb_[iVar3 == 0].value_ = this->color_bb_[iVar3 == 0].value_ & uVar15;
      uVar16 = 1L << sVar11 ^ 1L << uVar16;
      this->piece_type_bb_
      [(int)oVar8.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
            super__Optional_payload_base<libchess::PieceType>._M_payload].value_ =
           this->piece_type_bb_
           [(int)oVar8.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                 super__Optional_payload_base<libchess::PieceType>._M_payload].value_ ^ uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ ^ uVar16;
      break;
    case 7:
      uVar16 = -2L << sVar11 | 0xfffffffffffffffeU >> 0x40 - sVar11;
      this->piece_type_bb_
      [(int)oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
            super__Optional_payload_base<libchess::PieceType>._M_payload].value_ =
           this->piece_type_bb_
           [(int)oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                 super__Optional_payload_base<libchess::PieceType>._M_payload].value_ & uVar16;
      this->color_bb_[iVar3 == 0].value_ = this->color_bb_[iVar3 == 0].value_ & uVar16;
      uVar16 = -2L << sVar12 | 0xfffffffffffffffeU >> 0x40 - sVar12;
      this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ & uVar16;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ & uVar16;
      this->piece_type_bb_[uVar14].value_ = this->piece_type_bb_[uVar14].value_ | 1L << sVar11;
      this->color_bb_[lVar13].value_ = this->color_bb_[lVar13].value_ | 1L << sVar11;
    }
  }
  (pSVar2->captured_pt_).super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType> =
       (_Optional_payload_base<libchess::PieceType>)
       oVar9.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::PieceType>;
  pSVar2->move_type_ = TVar6;
  (this->side_to_move_).super_MetaValueType<int>.value_ =
       (uint)((this->side_to_move_).super_MetaValueType<int>.value_ == 0);
  hVar10 = calculate_hash(this);
  pSVar2->hash_ = hVar10;
  hVar10 = calculate_pawn_hash(this);
  pSVar2->pawn_hash_ = hVar10;
  return;
}

Assistant:

inline void Position::make_move(Move move) {
    Color stm = side_to_move();
    if (stm == constants::BLACK) {
        ++fullmoves_;
    }
    ++ply_;
    history_.push_back(State{});
    State& prev_state = state_mut_ref(ply_ - 1);
    State& next_state = state_mut_ref();
    next_state.halfmoves_ = prev_state.halfmoves_ + 1;
    next_state.previous_move_ = move;
    next_state.enpassant_square_ = {};

    Square from_square = move.from_square();
    Square to_square = move.to_square();

    next_state.castling_rights_ = CastlingRights{prev_state.castling_rights_.value() &
                                                 castling_spoilers[from_square.value()] &
                                                 castling_spoilers[to_square.value()]};

    auto moving_pt = piece_type_on(from_square);
    auto captured_pt = piece_type_on(to_square);
    auto promotion_pt = move.promotion_piece_type();

    Move::Type move_type = move_type_of(move);

    if (moving_pt == constants::PAWN || captured_pt) {
        next_state.halfmoves_ = 0;
    }

    switch (move_type) {
    case Move::Type::NORMAL:
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::CAPTURE:
        remove_piece(to_square, *captured_pt, !stm);
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::DOUBLE_PUSH:
        move_piece(from_square, to_square, constants::PAWN, stm);
        next_state.enpassant_square_ =
            stm == constants::WHITE ? Square(from_square + 8) : Square(from_square - 8);
        break;
    case Move::Type::ENPASSANT:
        move_piece(from_square, to_square, constants::PAWN, stm);
        remove_piece(stm == constants::WHITE ? Square(to_square - 8) : Square(to_square + 8),
                     constants::PAWN, !stm);
        break;
    case Move::Type::CASTLING:
        move_piece(from_square, to_square, constants::KING, stm);
        switch (to_square) {
        case constants::C1:
            move_piece(constants::A1, constants::D1, constants::ROOK, stm);
            break;
        case constants::G1:
            move_piece(constants::H1, constants::F1, constants::ROOK, stm);
            break;
        case constants::C8:
            move_piece(constants::A8, constants::D8, constants::ROOK, stm);
            break;
        case constants::G8:
            move_piece(constants::H8, constants::F8, constants::ROOK, stm);
            break;
        default:
            break;
        }
        break;
    case Move::Type::PROMOTION:
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::CAPTURE_PROMOTION:
        remove_piece(to_square, *captured_pt, !stm);
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::NONE:
        break;
    }
    next_state.captured_pt_ = captured_pt;
    next_state.move_type_ = move_type;
    reverse_side_to_move();
    next_state.hash_ = calculate_hash();
    next_state.pawn_hash_ = calculate_pawn_hash();
}